

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ini.hpp
# Opt level: O1

vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *
CLI::detail::parse_ini
          (vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
           *__return_storage_ptr__,istream *input)

{
  pointer pbVar1;
  pointer piVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  long lVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  string item;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string section;
  string name;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string local_150;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *local_130;
  string local_128;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_a8 = local_98;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"default","");
  (__return_storage_ptr__->
  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar1 = (pointer)(local_108 + 0x10);
  local_130 = __return_storage_ptr__;
  while( true ) {
    cVar3 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + (char)input);
    piVar5 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input,(string *)&local_128,cVar3);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_150._M_dataplus._M_p = local_128._M_dataplus._M_p + local_128._M_string_length;
    local_108._0_8_ = local_128._M_dataplus._M_p;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (&local_68,&local_150,local_108);
    local_128._M_string_length =
         (long)local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - (long)local_128._M_dataplus._M_p;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&(local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->_M_local_buf[0] = '\0';
    _Var6 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                      ();
    if (local_128._M_dataplus._M_p + local_128._M_string_length == _Var6._M_current) {
      local_128._M_string_length = 0;
      *local_128._M_dataplus._M_p = '\0';
    }
    else {
      ::std::__cxx11::string::_M_erase((ulong)&local_128,0);
    }
    if (((local_128._M_string_length < 2) || (*local_128._M_dataplus._M_p != '[')) ||
       (local_128._M_dataplus._M_p[local_128._M_string_length - 1] != ']')) {
      if ((local_128._M_string_length != 0) && (*local_128._M_dataplus._M_p != ';')) {
        std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::emplace_back<>
                  (__return_storage_ptr__);
        piVar2 = (__return_storage_ptr__->
                 super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        lVar7 = ::std::__cxx11::string::find((char *)&local_128,0x117387,0);
        if (lVar7 == -1) {
          trim_copy(&local_150,&local_128);
          ::std::__cxx11::string::operator=((string *)&local_88,(string *)&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"ON","");
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                     &local_150,&local_130);
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_108,(ulong)&local_128);
          trim_copy(&local_150,(string *)local_108);
          ::std::__cxx11::string::operator=((string *)&local_88,(string *)&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((pointer)local_108._0_8_ != pbVar1) {
            operator_delete((void *)local_108._0_8_);
          }
          ::std::__cxx11::string::substr((ulong)local_108,(ulong)&local_128);
          trim_copy(&local_150,(string *)local_108);
          if ((pointer)local_108._0_8_ != pbVar1) {
            operator_delete((void *)local_108._0_8_);
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,local_150._M_dataplus._M_p,
                     local_150._M_dataplus._M_p + local_150._M_string_length);
          split_up(&local_68,&local_50);
          local_108._16_8_ =
               local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_108._8_8_ =
               local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_108._0_8_ =
               local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_108);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        local_e8 = &local_d8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,local_a8,local_a8 + local_a0);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_e8,local_e8->_M_local_buf + local_e0,local_e8);
        if (local_e8 == &local_d8) {
          local_150.field_2._8_8_ = local_d8._8_8_;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150._M_dataplus._M_p = (pointer)local_e8;
        }
        local_150.field_2._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
        local_150.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
        local_150._M_string_length = local_e0;
        local_e0 = 0;
        local_d8._M_local_buf[0] = '\0';
        local_e8 = &local_d8;
        iVar4 = ::std::__cxx11::string::compare((char *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        __return_storage_ptr__ = local_130;
        if (iVar4 == 0) {
          ::std::__cxx11::string::_M_assign((string *)(piVar2 + -1));
        }
        else {
          local_108._0_8_ = pbVar1;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_108,local_a8,local_a8 + local_a0);
          ::std::__cxx11::string::append((char *)local_108);
          puVar8 = (undefined8 *)
                   ::std::__cxx11::string::_M_append((char *)local_108,(ulong)local_88);
          psVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_150.field_2._M_allocated_capacity = *psVar9;
            local_150.field_2._8_8_ = puVar8[3];
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          }
          else {
            local_150.field_2._M_allocated_capacity = *psVar9;
            local_150._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_150._M_string_length = puVar8[1];
          *puVar8 = psVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)(piVar2 + -1),(string *)&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((pointer)local_108._0_8_ != pbVar1) {
            operator_delete((void *)local_108._0_8_);
          }
        }
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &piVar2[-1].inputs,
                   piVar2[-1].inputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_c8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else {
      ::std::__cxx11::string::substr((ulong)&local_150,(ulong)&local_128);
      ::std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<ini_ret_t> parse_ini(std::istream &input) {
    std::string name, line;
    std::string section = "default";

    std::vector<ini_ret_t> output;

    while(getline(input, line)) {
        std::vector<std::string> items;

        detail::trim(line);
        size_t len = line.length();
        if(len > 1 && line[0] == '[' && line[len - 1] == ']') {
            section = line.substr(1, len - 2);
        } else if(len > 0 && line[0] != ';') {
            output.emplace_back();
            ini_ret_t &out = output.back();

            // Find = in string, split and recombine
            auto pos = line.find("=");
            if(pos != std::string::npos) {
                name = detail::trim_copy(line.substr(0, pos));
                std::string item = detail::trim_copy(line.substr(pos + 1));
                items = detail::split_up(item);
            } else {
                name = detail::trim_copy(line);
                items = {"ON"};
            }

            if(detail::to_lower(section) == "default")
                out.fullname = name;
            else
                out.fullname = section + "." + name;

            out.inputs.insert(std::end(out.inputs), std::begin(items), std::end(items));
        }
    }
    return output;
}